

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::AssertionResult::AssertionResult
          (AssertionResult *this,AssertionInfo *info,AssertionResultData *data)

{
  AssertionInfo::AssertionInfo(&this->m_info,info);
  AssertionResultData::AssertionResultData(&this->m_resultData,data);
  return;
}

Assistant:

AssertionResult::AssertionResult(AssertionInfo const& info, AssertionResultData const& data)
		: m_info(info),
		m_resultData(data)
	{}